

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utglTF2ImportExport.cpp
# Opt level: O3

void __thiscall
utglTF2ImportExport_importglTF2PrimitiveModeTrianglesFan_Test::TestBody
          (utglTF2ImportExport_importglTF2PrimitiveModeTrianglesFan_Test *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  array<unsigned_int,_3UL> f2;
  array<unsigned_int,_3UL> f1;
  aiScene *scene;
  Importer importer;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  undefined4 local_68;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined4 local_50;
  aiScene *local_48;
  AssertHelper local_40;
  Importer local_38;
  
  Assimp::Importer::Importer(&local_38);
  local_48 = Assimp::Importer::ReadFile
                       (&local_38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_12.gltf"
                        ,0x400);
  local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            (local_80,"nullptr","scene",&local_58.ptr_,&local_48);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0x146,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_80,"scene->mMeshes[0]->mNumVertices","4u",&(*local_48->mMeshes)->mNumVertices,
             (uint *)&local_58);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0x147,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_80,"scene->mMeshes[0]->mNumFaces","2u",&(*local_48->mMeshes)->mNumFaces,
             (uint *)&local_58);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0x148,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000000;
  local_50 = 2;
  local_70.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_80,"scene->mMeshes[0]->mFaces[0].mNumIndices","3u",
             &(*local_48->mMeshes)->mFaces->mNumIndices,(uint *)&local_70);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0x14a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar2 = 0;
  do {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_80,"scene->mMeshes[0]->mFaces[0].mIndices[i]","f1[i]",
               (uint *)((long)(*local_48->mMeshes)->mFaces->mIndices + lVar2),
               (uint *)((long)&local_58.ptr_ + lVar2));
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar3 = "";
      if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
                 ,0x14c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  local_70.data_ = (AssertHelperData *)0x200000000;
  local_68 = 1;
  local_60.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_80,"scene->mMeshes[0]->mFaces[1].mNumIndices","3u",
             &(*local_48->mMeshes)->mFaces[1].mNumIndices,(uint *)&local_60);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0x150,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar2 = 0;
  do {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_80,"scene->mMeshes[0]->mFaces[1].mIndices[i]","f2[i]",
               (uint *)((long)(*local_48->mMeshes)->mFaces[1].mIndices + lVar2),
               (uint *)((long)&local_70.data_ + lVar2));
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar3 = "";
      if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
                 ,0x152,pcVar3);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  Assimp::Importer::~Importer(&local_38);
  return;
}

Assistant:

TEST_F(utglTF2ImportExport, importglTF2PrimitiveModeTrianglesFan) {
    Assimp::Importer importer;
    //Triangles fan
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_12.gltf", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);
    EXPECT_EQ(scene->mMeshes[0]->mNumVertices, 4u);
    EXPECT_EQ(scene->mMeshes[0]->mNumFaces, 2u);
    std::array<unsigned int, 3> f1 = {{ 0u, 3u, 2u }};
    EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mNumIndices, 3u );
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mIndices[i], f1[i]);
    }

    std::array<unsigned int, 3> f2 = {{ 0u, 2u, 1u }};
    EXPECT_EQ(scene->mMeshes[0]->mFaces[1].mNumIndices, 3u );
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[1].mIndices[i], f2[i]);
    }
}